

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlSwitchInputEncodingName(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,char *encoding)

{
  xmlParserErrors xVar1;
  xmlCharEncodingHandlerPtr pxStack_30;
  xmlParserErrors res;
  xmlCharEncodingHandlerPtr handler;
  char *encoding_local;
  xmlParserInputPtr input_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (encoding == (char *)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    handler = (xmlCharEncodingHandlerPtr)encoding;
    encoding_local = (char *)input;
    input_local = (xmlParserInputPtr)ctxt;
    xVar1 = xmlCreateCharEncodingHandler
                      (encoding,XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,&stack0xffffffffffffffd0
                      );
    if (xVar1 == XML_ERR_UNSUPPORTED_ENCODING) {
      xmlWarningMsg((xmlParserCtxtPtr)input_local,XML_ERR_UNSUPPORTED_ENCODING,
                    "Unsupported encoding: %s\n",(xmlChar *)handler,(xmlChar *)0x0);
      ctxt_local._4_4_ = -1;
    }
    else if (xVar1 == XML_ERR_OK) {
      xVar1 = xmlInputSetEncodingHandler((xmlParserInputPtr)encoding_local,pxStack_30);
      if (xVar1 == XML_ERR_OK) {
        ctxt_local._4_4_ = 0;
      }
      else {
        xmlCtxtErrIO((xmlParserCtxtPtr)input_local,xVar1,(char *)0x0);
        ctxt_local._4_4_ = -1;
      }
    }
    else {
      xmlFatalErr((xmlParserCtxtPtr)input_local,xVar1,(char *)handler);
      ctxt_local._4_4_ = -1;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSwitchInputEncodingName(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                           const char *encoding) {
    xmlCharEncodingHandlerPtr handler;
    xmlParserErrors res;

    if (encoding == NULL)
        return(-1);

    res = xmlCreateCharEncodingHandler(encoding, XML_ENC_INPUT,
            ctxt->convImpl, ctxt->convCtxt, &handler);
    if (res == XML_ERR_UNSUPPORTED_ENCODING) {
        xmlWarningMsg(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
                      "Unsupported encoding: %s\n", BAD_CAST encoding, NULL);
        return(-1);
    } else if (res != XML_ERR_OK) {
        xmlFatalErr(ctxt, res, encoding);
        return(-1);
    }

    res  = xmlInputSetEncodingHandler(input, handler);
    if (res != XML_ERR_OK) {
        xmlCtxtErrIO(ctxt, res, NULL);
        return(-1);
    }

    return(0);
}